

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O2

void Cec_GiaSplitExplore(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Gia_Obj_t *pObj;
  uint uVar4;
  int v;
  Gia_Obj_t *pFan1;
  Gia_Obj_t *pFan0;
  Gia_Obj_t *local_40;
  Gia_Obj_t *local_38;
  
  if (p->pMuxes != (uint *)0x0) {
    __assert_fail("p->pMuxes == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSplit.c"
                  ,0x96,"void Cec_GiaSplitExplore(Gia_Man_t *)");
  }
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(p);
  v = 0;
  uVar4 = 0;
  while( true ) {
    if (p->nObjs <= v) {
      return;
    }
    pObj = Gia_ManObj(p,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    if ((((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) &&
        (iVar1 = Gia_ObjRecognizeExor(pObj,&local_38,&local_40), iVar1 != 0)) &&
       ((iVar1 = Gia_ObjRefNum(p,pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff)), iVar1 < 2
        || (iVar1 = Gia_ObjRefNum(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff)),
           iVar1 < 2)))) {
      printf("%5d : ",(ulong)uVar4);
      uVar2 = Gia_ObjRefNum(p,(Gia_Obj_t *)((ulong)local_38 & 0xfffffffffffffffe));
      uVar3 = Gia_ObjRefNum(p,(Gia_Obj_t *)((ulong)local_40 & 0xfffffffffffffffe));
      printf("%2d %2d    ",(ulong)uVar2,(ulong)uVar3);
      uVar2 = Gia_ObjRefNum(p,pObj + -(*(ulong *)pObj & 0x1fffffff));
      uVar3 = Gia_ObjRefNum(p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
      printf("%2d %2d  \n",(ulong)uVar2,(ulong)uVar3);
      uVar4 = uVar4 + 1;
    }
    v = v + 1;
  }
  return;
}

Assistant:

void Cec_GiaSplitExplore( Gia_Man_t * p )
{
    Gia_Obj_t * pObj, * pFan0, * pFan1;
    int i, Counter = 0;
    assert( p->pMuxes == NULL );
    ABC_FREE( p->pRefs );
    Gia_ManCreateRefs( p ); 
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( !Gia_ObjRecognizeExor(pObj, &pFan0, &pFan1) )
            continue;
        if ( Gia_ObjRefNum(p, Gia_ObjFanin0(pObj)) > 1 && 
             Gia_ObjRefNum(p, Gia_ObjFanin1(pObj)) > 1 )
             continue;
        printf( "%5d : ", Counter++ );
        printf( "%2d %2d    ", Gia_ObjRefNum(p, Gia_Regular(pFan0)),  Gia_ObjRefNum(p, Gia_Regular(pFan1)) );
        printf( "%2d %2d  \n", Gia_ObjRefNum(p, Gia_ObjFanin0(pObj)), Gia_ObjRefNum(p, Gia_ObjFanin1(pObj)) );
    }
}